

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
ParserTestNoDeadPointerFromDuplicateEdge::Run(ParserTestNoDeadPointerFromDuplicateEdge *this)

{
  int iVar1;
  int iVar2;
  int fail_count;
  ParserTestNoDeadPointerFromDuplicateEdge *this_local;
  
  iVar1 = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild out: cat in\nbuild out: cat in\n");
  iVar2 = testing::Test::AssertionFailures(g_current_test);
  if (iVar1 != iVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, NoDeadPointerFromDuplicateEdge) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build out: cat in\n"
"build out: cat in\n"
));
  // AssertParse() checks that the generated build graph is self-consistent.
  // That's all the checking that this test needs.
}